

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

void __thiscall
lzham::quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
          (quasi_adaptive_huffman_data_model *this,lzham_malloc_context malloc_context,bool encoding
          ,uint total_syms,uint max_update_interval,uint adapt_rate)

{
  this->m_malloc_context = malloc_context;
  (this->m_initial_sym_freq).m_p = (unsigned_short *)0x0;
  (this->m_initial_sym_freq).m_size = 0;
  (this->m_initial_sym_freq).m_capacity = 0;
  (this->m_initial_sym_freq).m_malloc_context = malloc_context;
  (this->m_sym_freq).m_p = (unsigned_short *)0x0;
  (this->m_sym_freq).m_size = 0;
  (this->m_sym_freq).m_capacity = 0;
  (this->m_sym_freq).m_malloc_context = malloc_context;
  (this->m_codes).m_p = (unsigned_short *)0x0;
  (this->m_codes).m_size = 0;
  (this->m_codes).m_capacity = 0;
  (this->m_codes).m_malloc_context = malloc_context;
  (this->m_code_sizes).m_p = (uchar *)0x0;
  (this->m_code_sizes).m_size = 0;
  (this->m_code_sizes).m_capacity = 0;
  (this->m_code_sizes).m_malloc_context = malloc_context;
  this->m_pDecode_tables = (decoder_tables *)0x0;
  this->m_total_syms = 0;
  this->m_max_cycle = 0;
  *(undefined8 *)((long)&this->m_max_cycle + 1) = 0;
  *(undefined8 *)((long)&this->m_symbols_until_update + 1) = 0;
  this->m_max_update_interval = (uint16)max_update_interval;
  this->m_adapt_rate = (uint16)adapt_rate;
  this->m_encoding = encoding;
  if (total_syms != 0) {
    init2(this,malloc_context,encoding,total_syms,max_update_interval,adapt_rate,(uint16 *)0x0);
  }
  return;
}

Assistant:

quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(lzham_malloc_context malloc_context, bool encoding, uint total_syms, uint max_update_interval, uint adapt_rate) :
      m_malloc_context(malloc_context),
      m_initial_sym_freq(malloc_context),
      m_sym_freq(malloc_context),
      m_codes(malloc_context),
      m_code_sizes(malloc_context),
      m_pDecode_tables(NULL),
      m_total_syms(0),
      m_max_cycle(0),
      m_update_cycle(0),
      m_symbols_until_update(0),
      m_total_count(0),
      m_decoder_table_bits(0),
      m_max_update_interval(static_cast<uint16>(max_update_interval)),
      m_adapt_rate(static_cast<uint16>(adapt_rate)),
      m_encoding(encoding)
   {
      if (total_syms)
      {
         init2(malloc_context, encoding, total_syms, max_update_interval, adapt_rate, NULL);
      }
   }